

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRect __thiscall QDockAreaLayoutInfo::tabContentRect(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  QRect QVar6;
  
  if (this->tabbed == true) {
    uVar4 = *(ulong *)&this->rect;
    uVar3 = *(ulong *)&(this->rect).x2;
    uVar5 = uVar4 >> 0x20;
    bVar1 = updateTabBar(this);
    if ((bVar1) &&
       (uVar2 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x70))(), uVar2 != 0)) {
      switch(this->tabBarShape) {
      case 0:
      case 4:
        uVar5 = (ulong)(uint)((int)(uVar4 >> 0x20) + (int)(uVar2 >> 0x20));
        break;
      case 1:
      case 5:
        uVar3 = uVar3 & 0xffffffff | uVar3 - (uVar2 & 0xffffffff00000000) & 0xffffffff00000000;
        break;
      case 2:
      case 6:
        uVar4 = uVar4 + uVar2;
        break;
      case 3:
      case 7:
        uVar3 = uVar3 & 0xffffffff00000000 | (ulong)(uint)((int)uVar3 - (int)uVar2);
      }
    }
  }
  else {
    uVar3 = 0xffffffffffffffff;
    uVar5 = 0;
    uVar4 = 0;
  }
  QVar6._0_8_ = uVar4 & 0xffffffff | uVar5 << 0x20;
  QVar6.x2.m_i = (int)uVar3;
  QVar6.y2.m_i = (int)(uVar3 >> 0x20);
  return QVar6;
}

Assistant:

QRect QDockAreaLayoutInfo::tabContentRect() const
{
    if (!tabbed)
        return QRect();

    QRect result = rect;
    QSize tbh = tabBarSizeHint();

    if (!tbh.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::TriangularNorth:
                result.adjust(0, tbh.height(), 0, 0);
                break;
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularSouth:
                result.adjust(0, 0, 0, -tbh.height());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::TriangularEast:
                result.adjust(0, 0, -tbh.width(), 0);
                break;
            case QTabBar::RoundedWest:
            case QTabBar::TriangularWest:
                result.adjust(tbh.width(), 0, 0, 0);
                break;
            default:
                break;
        }
    }

    return result;
}